

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GC.cpp
# Opt level: O1

Table * __thiscall luna::GC::NewTable(GC *this,GCGeneration gen)

{
  Table *this_00;
  
  this_00 = (Table *)operator_new(0x28);
  Table::Table(this_00);
  (this_00->super_GCObject).field_0x10 = (this_00->super_GCObject).field_0x10 & 0xf | 0x10;
  SetObjectGen(this,(GCObject *)this_00,gen);
  return this_00;
}

Assistant:

Table * GC::NewTable(GCGeneration gen)
    {
        auto t = new Table;
        t->gc_obj_type_ = GCObjectType_Table;
        SetObjectGen(t, gen);
        return t;
    }